

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

void am_generic_add_part(Am_Object *owner,Am_Object *old_object,Am_Object *new_object)

{
  bool bVar1;
  unsigned_short uVar2;
  int value;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List components;
  Am_Object current_obj;
  Am_Value_List local_60;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Slot local_38;
  
  Am_Value_List::Am_Value_List(&local_60);
  bVar1 = Am_Object::Valid(old_object);
  if (bVar1) {
    Am_Object::Am_Object(&local_40,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(old_object,&local_40);
    Am_Object::~Am_Object(&local_40);
    if (bVar1) {
      Am_Object::Make_Unique(owner,0x82);
      pAVar3 = Am_Object::Get(owner,0x82,0);
      Am_Value_List::operator=(&local_60,pAVar3);
      Am_Value_List::Start(&local_60);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(old_object);
      bVar1 = Am_Value_List::Member(&local_60,pAVar4);
      if (bVar1) {
        Am_Value_List::Delete(&local_60,false);
        pAVar3 = Am_Object::Get(old_object,0x85,0);
        value = Am_Value::operator_cast_to_int(pAVar3);
        Am_Value_List::Next(&local_60);
        local_48.data = (Am_Object_Data *)0x0;
        while( true ) {
          bVar1 = Am_Value_List::Last(&local_60);
          if (bVar1) break;
          pAVar3 = Am_Value_List::Get(&local_60);
          Am_Object::operator=(&local_48,pAVar3);
          Am_Object::Set(&local_48,0x85,value,0);
          value = value + 1;
          Am_Value_List::Next(&local_60);
        }
        local_38 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)old_object,100);
        Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_move,0,&local_38);
        Am_Object::Note_Changed(owner,0x82);
        Am_Object::~Am_Object(&local_48);
      }
    }
  }
  bVar1 = Am_Object::Valid(new_object);
  if (bVar1) {
    Am_Object::Am_Object(&local_50,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(new_object,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (bVar1) {
      Am_Object::Make_Unique(owner,0x82);
      pAVar3 = Am_Object::Get(owner,0x82,0);
      Am_Value_List::operator=(&local_60,pAVar3);
      bVar1 = Am_Value_List::Valid(&local_60);
      uVar2 = Am_Value_List::Length(&local_60);
      Am_Object::Set(new_object,0x85,(uint)uVar2,0);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(new_object);
      Am_Value_List::Add(&local_60,pAVar4,Am_TAIL,false);
      local_48.data =
           (Am_Object_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)new_object,100);
      Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_move,0,(Am_Slot *)&local_48);
      if (bVar1) {
        Am_Object::Note_Changed(owner,0x82);
      }
      else {
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_60);
        Am_Object::Set(owner,0x82,pAVar4,0);
      }
    }
  }
  Am_Value_List::~Am_Value_List(&local_60);
  return;
}

Assistant:

void
am_generic_add_part(Am_Object owner, Am_Object old_object, Am_Object new_object)
{
  Am_Value_List components;
  if (old_object.Valid() && old_object.Is_Instance_Of(Am_Graphical_Object)) {
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    components = owner.Get(Am_GRAPHICAL_PARTS);
    components.Start();
    if (components.Member(old_object)) {
      components.Delete(false);
      int current_rank = old_object.Get(Am_RANK);
      components.Next();
      Am_Object current_obj;
      while (!components.Last()) {
        current_obj = components.Get();
        current_obj.Set(Am_RANK, current_rank);
        ++current_rank;
        components.Next();
      }
      Main_Demon_Queue.Enqueue(
          graphics_move, 0,
          ((Am_Object_Advanced &)old_object).Get_Slot(Am_LEFT));
      owner.Note_Changed(Am_GRAPHICAL_PARTS);
    }
  }
  if (new_object.Valid() && new_object.Is_Instance_Of(Am_Graphical_Object)) {
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    components = owner.Get(Am_GRAPHICAL_PARTS);
    bool was_valid = components.Valid();
    new_object.Set(Am_RANK, (int)components.Length());
    components.Add(new_object, Am_TAIL, false);
    Main_Demon_Queue.Enqueue(
        graphics_move, 0, ((Am_Object_Advanced &)new_object).Get_Slot(Am_LEFT));
    if (was_valid)
      owner.Note_Changed(Am_GRAPHICAL_PARTS);
    else
      owner.Set(Am_GRAPHICAL_PARTS, components);
  }
}